

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O1

int zhash_get_volatile(zhash_t *zh,void *key,void *out_value)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = (*zh->hash)(key);
  uVar4 = zh->nentries - 1U & uVar1;
  while( true ) {
    uVar2 = zh->entrysz * uVar4;
    if (zh->entries[uVar2] == '\0') {
      return 0;
    }
    iVar3 = (*zh->equals)(key,zh->entries + (uVar2 + 1));
    if (iVar3 != 0) break;
    uVar4 = uVar4 + 1 & zh->nentries - 1U;
  }
  *(char **)out_value = zh->entries + (ulong)(zh->entrysz * uVar4 + 1) + zh->keysz;
  return 1;
}

Assistant:

int zhash_get_volatile(const zhash_t *zh, const void *key, void *out_value)
{
    uint32_t code = zh->hash(key);
    uint32_t entry_idx = code & (zh->nentries - 1);

    while (zh->entries[entry_idx * zh->entrysz]) {
        void *this_key = &zh->entries[entry_idx * zh->entrysz + 1];
        if (zh->equals(key, this_key)) {
            *((void**) out_value) = &zh->entries[entry_idx * zh->entrysz + 1 + zh->keysz];
            return 1;
        }

        entry_idx = (entry_idx + 1) & (zh->nentries - 1);
    }

    return 0;
}